

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TopLevelArraySizeValidator::validateSingleVariable
          (TopLevelArraySizeValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  ostringstream *poVar1;
  VariableDeclaration *pVVar2;
  int iVar3;
  allocator<char> local_1c1;
  string reason;
  undefined1 local_1a0 [384];
  
  reason._M_dataplus._M_p = (pointer)&reason.field_2;
  reason._M_string_length = 0;
  reason.field_2._M_local_buf[0] = '\0';
  pVVar2 = (path->
           super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           )._M_impl.super__Vector_impl_data._M_start[1].m_data.declaration;
  if (((pVVar2->varType).m_type == TYPE_ARRAY) &&
     (((pVVar2->varType).m_data.array.elementType)->m_type != 0)) {
    iVar3 = *(int *)((long)&(pVVar2->varType).m_data + 8);
    if (iVar3 == -1) {
      iVar3 = 0;
      std::__cxx11::string::assign((char *)&reason);
    }
    else {
      std::__cxx11::string::assign((char *)&reason);
    }
  }
  else {
    std::__cxx11::string::assign((char *)&reason);
    iVar3 = 1;
  }
  local_1a0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Verifying top level array size, expecting ");
  std::ostream::operator<<(poVar1,iVar3);
  std::operator<<((ostream *)poVar1,". (");
  std::operator<<((ostream *)poVar1,(string *)&reason);
  std::operator<<((ostream *)poVar1,").");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  if (iVar3 != propValue) {
    local_1a0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"\tError, invalid top level array size, got ");
    std::ostream::operator<<(poVar1,propValue);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a0,"top level array size invalid",&local_1c1);
    PropValidator::setError((PropValidator *)this,(string *)local_1a0);
    std::__cxx11::string::~string((string *)local_1a0);
  }
  std::__cxx11::string::~string((string *)&reason);
  return;
}

Assistant:

void TopLevelArraySizeValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	int			expected;
	std::string	reason;

	DE_ASSERT(path.front().isInterfaceBlock() && path.front().getInterfaceBlock()->storage == glu::STORAGE_BUFFER);
	DE_UNREF(resource);
	DE_UNREF(implementationName);

	if (!path[1].getDeclaration()->varType.isArrayType())
	{
		expected = 1;
		reason = "Top-level block member is not an array";
	}
	else if (path[1].getDeclaration()->varType.getElementType().isBasicType())
	{
		expected = 1;
		reason = "Top-level block member is not an array of an aggregate type";
	}
	else if (path[1].getDeclaration()->varType.getArraySize() == glu::VarType::UNSIZED_ARRAY)
	{
		expected = 0;
		reason = "Top-level block member is an unsized top-level array";
	}
	else
	{
		expected = path[1].getDeclaration()->varType.getArraySize();
		reason = "Top-level block member is a sized top-level array";
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying top level array size, expecting " << expected << ". (" << reason << ")." << tcu::TestLog::EndMessage;

	if (propValue != expected)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, invalid top level array size, got " << propValue << tcu::TestLog::EndMessage;
		setError("top level array size invalid");
	}
}